

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

reference __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>_>
::iterator::operator*(iterator *this)

{
  ctrl_t *pcVar1;
  
  pcVar1 = this->ctrl_;
  if (pcVar1 == (ctrl_t *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>const,std::pair<int,int>>>>
    ::iterator::operator*((iterator *)this);
  }
  else if (pcVar1 != kEmptyGroup + 0x10) {
    if (kSentinel < *pcVar1) {
      return (reference)(this->field_1).slot_;
    }
    goto LAB_002052f8;
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>const,std::pair<int,int>>>>
  ::iterator::operator*((iterator *)this);
LAB_002052f8:
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>const,std::pair<int,int>>>>
  ::iterator::operator*((iterator *)this);
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }